

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void ppc_cpu_reset(CPUState *dev)

{
  CPUPPCState_conflict2 *env_00;
  ppc_spr_t_conflict2 *spr;
  target_ulong tStack_38;
  int i;
  target_ulong msr;
  CPUPPCState_conflict2 *env;
  PowerPCCPUClass_conflict1 *pcc;
  PowerPCCPU_conflict4 *cpu;
  CPUState *s;
  CPUState *dev_local;
  
  env_00 = (CPUPPCState_conflict2 *)(dev[1].tb_jmp_cache + 0x359);
  (*(code *)dev[3].tb_jmp_cache[0xa5e])(dev);
  tStack_38 = 0x1000000000000040;
  if (((ulong)dev[3].tb_jmp_cache[0x8d8] & 0x10000) != 0) {
    tStack_38 = 0x9000000000000040;
  }
  hreg_store_msr(env_00,tStack_38,1);
  dev[1].tb_jmp_cache[0x3ae] =
       (TranslationBlock *)((ulong)dev[3].tb_jmp_cache[0x949] | (ulong)dev[3].tb_jmp_cache[0x946]);
  if (*(int *)(dev[3].tb_jmp_cache + 0x8d8) != 6) {
    ppc_tlb_invalidate_all_ppc64(env_00);
  }
  hreg_compute_hflags(env_00);
  dev[1].tb_jmp_cache[0x3a6] = (TranslationBlock *)0xffffffffffffffff;
  *(undefined4 *)((long)dev[3].tb_jmp_cache + 0x46ec) = 0;
  dev->exception_index = -1;
  *(undefined4 *)(dev[3].tb_jmp_cache + 0x8dd) = 0;
  ppc_irq_reset_ppc64((PowerPCCPU_conflict3 *)dev);
  set_float_detect_tininess(1,(float_status *)((long)dev[3].tb_jmp_cache + 0x468c));
  for (spr._4_4_ = 0; spr._4_4_ < 0x400; spr._4_4_ = spr._4_4_ + 1) {
    if (dev[1].tb_jmp_cache[(long)(int)spr._4_4_ * 8 + 0x8c2] != (TranslationBlock *)0x0) {
      dev[1].tb_jmp_cache[(long)(int)spr._4_4_ + 0x4bc] =
           dev[1].tb_jmp_cache[(long)(int)spr._4_4_ * 8 + 0x8c3];
    }
  }
  return;
}

Assistant:

static void ppc_cpu_reset(CPUState *dev)
{
    CPUState *s = CPU(dev);
    PowerPCCPU *cpu = POWERPC_CPU(s);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cpu);
    CPUPPCState *env = &cpu->env;
    target_ulong msr;
    int i;

    pcc->parent_reset(dev);

    msr = (target_ulong)0;
    msr |= (target_ulong)MSR_HVB;
    msr |= (target_ulong)0 << MSR_AP; /* TO BE CHECKED */
    msr |= (target_ulong)0 << MSR_SA; /* TO BE CHECKED */
    msr |= (target_ulong)1 << MSR_EP;
#if defined(DO_SINGLE_STEP) && 0
    /* Single step trace mode */
    msr |= (target_ulong)1 << MSR_SE;
    msr |= (target_ulong)1 << MSR_BE;
#endif

#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        msr |= (1ULL << MSR_SF);
    }
#endif

    hreg_store_msr(env, msr, 1);

    env->nip = env->hreset_vector | env->excp_prefix;
    if (env->mmu_model != POWERPC_MMU_REAL) {
        ppc_tlb_invalidate_all(env);
    }

    hreg_compute_hflags(env);
#ifdef _MSC_VER
    env->reserve_addr = (target_ulong)(0ULL - 1ULL);
#else
    env->reserve_addr = (target_ulong)-1ULL;
#endif
    /* Be sure no exception or interrupt is pending */
    env->pending_interrupts = 0;
    s->exception_index = POWERPC_EXCP_NONE;
    env->error_code = 0;
    ppc_irq_reset(cpu);

    /* tininess for underflow is detected before rounding */
    set_float_detect_tininess(float_tininess_before_rounding,
                              &env->fp_status);

    for (i = 0; i < ARRAY_SIZE(env->spr_cb); i++) {
        ppc_spr_t *spr = &env->spr_cb[i];

        if (!spr->name) {
            continue;
        }
        env->spr[i] = spr->default_value;
    }
}